

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simple_object_pool.h
# Opt level: O2

pointer __thiscall
Gudhi::
Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>::
construct<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
          (Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
           *this,Persistent_cohomology_cell<unsigned_int,_int> *u)

{
  Column *pCVar1;
  int iVar2;
  pointer pPVar3;
  
  pPVar3 = (pointer)boost::pool<boost::default_user_allocator_malloc_free>::malloc
                              ((pool<boost::default_user_allocator_malloc_free> *)this,(size_t)u);
  if (pPVar3 != (pointer)0x0) {
    (pPVar3->super_base_hook_cam_h).super_type.super_type.super_list_node<void_*>.next_ =
         (node_ptr)0x0;
    (pPVar3->super_base_hook_cam_h).super_type.super_type.super_list_node<void_*>.prev_ =
         (node_ptr)0x0;
    iVar2 = u->coefficient_;
    pCVar1 = u->self_col_;
    pPVar3->key_ = u->key_;
    pPVar3->coefficient_ = iVar2;
    pPVar3->self_col_ = pCVar1;
    return pPVar3;
  }
  __assert_fail("p",
                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/common/include/gudhi/Simple_object_pool.h"
                ,0x33,
                "pointer Gudhi::Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned int, int>>::construct(U &&...) [T = Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned int, int>, U = <Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned int, int>>]"
               );
}

Assistant:

pointer construct(U&&...u) {
    void* p = base().malloc BOOST_PREVENT_MACRO_SUBSTITUTION();
    assert(p);
    try {
      new(p) T(std::forward<U>(u)...);
    }    catch (...) {
      base().free BOOST_PREVENT_MACRO_SUBSTITUTION(p);
      throw;
    }
    return static_cast<pointer> (p);
  }